

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> * __thiscall
mjs::regexp::impl::exec
          (vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *__return_storage_ptr__,
          impl *this,wstring_view str)

{
  bool bVar1;
  wchar_t *__s;
  const_pointer pvVar2;
  size_type sVar3;
  value_type local_90;
  reference local_80;
  sub_match<const_wchar_t_*> *m;
  const_iterator __end2;
  const_iterator __begin2;
  wcmatch *__range2;
  undefined1 local_48 [8];
  wcmatch match;
  impl *this_local;
  wstring_view str_local;
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *res;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (impl *)str._M_len;
  match._M_begin = (wchar_t *)this;
  str_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>::
  match_results((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                 *)local_48);
  __s = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data
                  ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  bVar1 = std::
          regex_search<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                    (__s,pvVar2 + sVar3,
                     (match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                      *)local_48,&this->r_,0);
  if (bVar1) {
    std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::vector
              (__return_storage_ptr__);
    __end2 = std::__cxx11::
             match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             ::begin((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                      *)local_48);
    m = (sub_match<const_wchar_t_*> *)
        std::__cxx11::
        match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>::
        end((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             *)local_48);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::sub_match<const_wchar_t_*>_*,_std::vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>_>
                                       *)&m), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::sub_match<const_wchar_t_*>_*,_std::vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>_>
                 ::operator*(&__end2);
      local_90.first = (local_80->super_pair<const_wchar_t_*,_const_wchar_t_*>).first;
      local_90.second = (local_80->super_pair<const_wchar_t_*,_const_wchar_t_*>).second;
      std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::push_back
                (__return_storage_ptr__,&local_90);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::sub_match<const_wchar_t_*>_*,_std::vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::vector
              (__return_storage_ptr__);
  }
  std::__cxx11::
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>::
  ~match_results((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                  *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<regexp_match> exec(const std::wstring_view str) const {
        std::wcmatch match;
        if (!std::regex_search(str.data(), str.data()+str.length(), match, r_)) {
            return {};
        }
        std::vector<regexp_match> res;
        for (const auto& m: match) {
            res.push_back(regexp_match{m.first, m.second});
        }
        return res;
    }